

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_benchmark.c
# Opt level: O0

void make_data(uint32_t spanlen,uint32_t intvlen,double density,order_t order,uint32_t **offsets_out
              ,uint32_t *count_out)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  undefined8 *in_RCX;
  int in_EDX;
  uint in_ESI;
  uint in_EDI;
  uint *in_R8;
  double in_XMM0_Qa;
  double dVar4;
  undefined1 auVar5 [16];
  uint32_t tmp;
  uint32_t j;
  uint32_t i_2;
  uint32_t gap;
  double v;
  uint32_t i_1;
  uint32_t i;
  uint64_t sum;
  uint32_t *offsets;
  uint32_t count;
  uint local_5c;
  uint local_58;
  uint32_t in_stack_ffffffffffffffac;
  uint32_t *in_stack_ffffffffffffffb0;
  uint local_48;
  uint local_44;
  long local_40;
  
  dVar4 = floor(((double)in_EDI * in_XMM0_Qa) / (double)in_ESI);
  uVar1 = (uint)(long)dVar4;
  puVar3 = (uint32_t *)malloc(((long)dVar4 & 0xffffffffU) << 2);
  local_40 = 0;
  for (local_44 = 0; local_44 < uVar1; local_44 = local_44 + 1) {
    uVar2 = pcg32_random_r(&pcg32_global);
    puVar3[local_44] = uVar2;
    local_40 = (ulong)puVar3[local_44] + local_40;
  }
  for (local_48 = 0; local_48 < uVar1; local_48 = local_48 + 1) {
    auVar5._8_4_ = (int)((ulong)local_40 >> 0x20);
    auVar5._0_8_ = local_40;
    auVar5._12_4_ = 0x45300000;
    in_stack_ffffffffffffffb0 =
         (uint32_t *)
         (((double)puVar3[local_48] /
          ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_40) - 4503599627370496.0))) *
         ((double)(in_EDI - uVar1 * in_ESI) / (double)in_ESI));
    dVar4 = floor((double)in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffffac = (uint32_t)(long)dVar4;
    if (local_48 == 0) {
      *puVar3 = in_stack_ffffffffffffffac;
    }
    else {
      puVar3[local_48] = puVar3[local_48 - 1] + in_ESI + in_stack_ffffffffffffffac;
    }
  }
  if (in_EDX == 2) {
    shuffle_uint32(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  else if (in_EDX == 1) {
    local_5c = uVar1;
    for (local_58 = 0; local_5c = local_5c - 1, local_58 < uVar1 >> 1; local_58 = local_58 + 1) {
      uVar2 = puVar3[local_58];
      puVar3[local_58] = puVar3[local_5c];
      puVar3[local_5c] = uVar2;
    }
  }
  *in_RCX = puVar3;
  *in_R8 = uVar1;
  return;
}

Assistant:

void make_data(uint32_t spanlen, uint32_t intvlen, double density,
               order_t order, uint32_t **offsets_out, uint32_t *count_out) {
    uint32_t count = floor(spanlen * density / intvlen);
    uint32_t *offsets = malloc(count * sizeof(uint32_t));

    uint64_t sum = 0;
    for (uint32_t i = 0; i < count; i++) {
        offsets[i] = pcg32_random_r(&pcg32_global);
        sum += offsets[i];
    }
    for (uint32_t i = 0; i < count; i++) {
        double v = offsets[i];
        v /= sum;
        v *= (spanlen - count * intvlen) / (double)intvlen;
        uint32_t gap = floor(v);

        if (i == 0) {
            offsets[i] = gap;
        } else {
            offsets[i] = offsets[i - 1] + intvlen + gap;
        }
    }

    if (order == SHUFFLE) {
        shuffle_uint32(offsets, count);
    } else if (order == DESC) {
        for (uint32_t i = 0, j = count - 1; i < count / 2; i++, j--) {
            uint32_t tmp = offsets[i];
            offsets[i] = offsets[j];
            offsets[j] = tmp;
        }
    }

    *offsets_out = offsets;
    *count_out = count;
}